

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaHash.c
# Opt level: O2

void Gia_ManHashStart(Gia_Man_t *p)

{
  int iLit0;
  int iLit1;
  Gia_Obj_t *pObj;
  int *piVar1;
  uint uVar2;
  int v;
  long lVar3;
  
  Gia_ManHashAlloc(p);
  lVar3 = 0;
  while( true ) {
    if (p->nObjs <= lVar3) {
      return;
    }
    v = (int)lVar3;
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) break;
    if ((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) {
      iLit0 = Gia_ObjFaninLit0(pObj,v);
      iLit1 = Gia_ObjFaninLit1(pObj,v);
      uVar2 = 0xffffffff;
      if (p->pMuxes != (uint *)0x0) {
        uVar2 = p->pMuxes[lVar3];
        uVar2 = -(uint)(uVar2 == 0) | uVar2;
      }
      piVar1 = Gia_ManHashFind(p,iLit0,iLit1,uVar2);
      if (*piVar1 != 0) {
        __assert_fail("*pPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaHash.c"
                      ,0x85,"void Gia_ManHashStart(Gia_Man_t *)");
      }
      *piVar1 = v;
    }
    lVar3 = lVar3 + 1;
  }
  return;
}

Assistant:

void Gia_ManHashStart( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int * pPlace, i;
    Gia_ManHashAlloc( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        pPlace = Gia_ManHashFind( p, Gia_ObjFaninLit0(pObj, i), Gia_ObjFaninLit1(pObj, i), Gia_ObjFaninLit2(p, i) );
        assert( *pPlace == 0 );
        *pPlace = i;
    }
}